

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O1

void google::protobuf::compiler::MockCodeGenerator::ExpectGenerated
               (string_view name,string_view parameter,string_view insertions,string_view file,
               string_view first_message_name,string_view first_parsed_file_name,
               string_view output_directory)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Nonnull<const_char_*> failure_msg;
  AlphaNum *c;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  string_view generator_name;
  string_view generator_name_00;
  string_view generator_name_01;
  string_view parameter_00;
  string_view parameter_01;
  string_view parameter_02;
  AssertionResult gtest_ar_1;
  string content;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertion_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  AssertionResult gtest_ar_5;
  undefined1 local_1d8 [8];
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  _Stack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [2];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1a0;
  pointer local_198;
  string local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [2];
  undefined1 local_128 [16];
  pointer local_118;
  AlphaNum local_f8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Status local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  AlphaNum *local_88;
  string local_80;
  string local_50;
  
  pcVar5 = insertions._M_str;
  c = (AlphaNum *)insertions._M_len;
  pcVar4 = name._M_str;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)output_directory._M_len;
  local_80._M_string_length = (size_type)output_directory._M_str;
  local_f8.piece_._M_len = 1;
  local_f8.piece_._M_str = "/";
  local_1d8 = (undefined1  [8])file._M_len;
  _Stack_1d0._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )file._M_str;
  local_1a8 = (undefined1  [8])0x13;
  paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x129b9a4;
  pcVar6 = pcVar5;
  local_158._M_allocated_capacity = (size_type)(MockCodeGenerator *)name._M_len;
  local_158._8_8_ = pcVar4;
  local_88 = c;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_50,(lts_20250127 *)local_1d8,(AlphaNum *)local_1a8,(AlphaNum *)&local_158,c);
  local_128._0_8_ = local_50._M_string_length;
  local_128._8_8_ = local_50._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_c8,(lts_20250127 *)&local_80,&local_f8,(AlphaNum *)local_128,c);
  local_90 = parameter._M_str;
  File::ReadFileToString((File *)&local_a8,(string *)local_c8,&local_178,false);
  local_98 = pcVar4;
  if ((StatusRep *)local_a8.rep_ == (StatusRep *)0x1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            (&local_a8,
                             "File::GetContents( absl::StrCat(output_directory, \"/\", GetOutputFileName(name, file)), &content, true) is OK"
                            );
  }
  if ((local_a8.rep_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_a8.rep_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
  }
  local_a0 = pcVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((StatusRep *)local_a8.rep_ == (StatusRep *)0x1) {
    local_1d8 = (undefined1  [8])local_178._M_string_length;
    _Stack_1d0._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )local_178._M_dataplus._M_p;
    local_1c8[0]._0_1_ = 10;
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8,
                 (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)local_1a8,
                 (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_1d8);
    while (((char *)local_f8.piece_._M_len != local_f8.piece_._M_str &&
           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)local_f8.piece_._M_str + -0x20))->_M_string_length == 0))) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_f8.piece_._M_str + -0x20);
      pcVar2 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_f8.piece_._M_str + -0x20))->_M_dataplus)._M_p;
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_f8.piece_._M_str + -0x20);
      local_f8.piece_._M_str = (char *)pbVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &pbVar3->field_2) {
        operator_delete(pcVar2,(pbVar3->field_2)._M_allocated_capacity + 1);
      }
    }
    if (local_f8.piece_._M_str != (char *)local_f8.piece_._M_len) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        local_1d8 = (undefined1  [8])0x1;
        _Stack_1d0._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              )((long)"\n abc \n def \n\n" + 0xd);
        absl::lts_20250127::StrAppend
                  ((Nonnull<std::string_*>)
                   ((long)&((_Alloc_hider *)local_f8.piece_._M_len)->_M_p + lVar7),
                   (AlphaNum *)local_1d8);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar8 < (ulong)((long)((long)local_f8.piece_._M_str - local_f8.piece_._M_len) >> 5));
    }
    local_128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_128._8_8_ = (LogMessageData *)0x0;
    local_118 = (pointer)0x0;
    if (local_88 != (AlphaNum *)0x0) {
      local_158._M_allocated_capacity = (size_type)local_88;
      local_158._8_8_ = local_a0;
      local_148[0]._M_local_buf[0] = ',';
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a8,
                   (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_1d8,
                   (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_158);
      local_1c8[0]._0_8_ = local_118;
      _Stack_1d0._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        )local_128._8_8_;
      local_1d8 = (undefined1  [8])local_128._0_8_;
      local_128._0_8_ = local_1a8;
      local_128._8_8_ = paStack_1a0;
      local_118 = local_198;
      local_1a8 = (undefined1  [8])0x0;
      paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_198 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a8);
    }
    local_1a8 = (undefined1  [8])
                ((long)((long)local_f8.piece_._M_str - local_f8.piece_._M_len) >> 5);
    local_158._M_allocated_capacity = ((long)(local_128._8_8_ - local_128._0_8_) >> 4) + 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_1d8,"lines.size()","3 + insertion_list.size() * 2",
               (unsigned_long *)local_1a8,&local_158._M_allocated_capacity);
    if (local_1d8[0] == (lts_20250127)0x0) {
      testing::Message::Message((Message *)local_1a8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )_Stack_1d0._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = *(char **)_Stack_1d0._M_t.
                           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           .
                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0x8d,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_158._M_allocated_capacity,(Message *)local_1a8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity);
      if (local_1a8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1a8 + 8))();
      }
    }
    if (_Stack_1d0._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1d0._M_t.
                   super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                   .
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl);
    }
    generator_name._M_str = (char *)parameter._M_len;
    generator_name._M_len = (size_t)local_98;
    parameter_00._M_str = pcVar6;
    parameter_00._M_len = (size_t)local_90;
    GetOutputFileContent_abi_cxx11_
              ((string *)local_1d8,(MockCodeGenerator *)name._M_len,generator_name,parameter_00,file
               ,first_parsed_file_name,first_message_name);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)local_1a8,
               "GetOutputFileContent(name, parameter, file, first_parsed_file_name, first_message_name)"
               ,"lines[0]",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_f8.piece_._M_len);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
    }
    if (local_1a8[0] ==
        (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         )0x0) {
      testing::Message::Message((Message *)local_1d8);
      if (paStack_1a0 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = (char *)paStack_1a0->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0x90,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_158._M_allocated_capacity,(Message *)local_1d8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity);
      if (local_1d8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1d8 + 8))();
      }
    }
    if (paStack_1a0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&paStack_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_1a0)
      ;
    }
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)local_1d8,"kFirstInsertionPoint","lines[1 + insertion_list.size()]",
               (basic_string_view<char,_std::char_traits<char>_> *)
               compiler::(anonymous_namespace)::kFirstInsertionPoint,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((char *)(local_128._8_8_ + (0x20 - local_128._0_8_)) +
               (long)(_Alloc_hider *)local_f8.piece_._M_len));
    if (local_1d8[0] == (lts_20250127)0x0) {
      testing::Message::Message((Message *)local_1a8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )_Stack_1d0._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = *(char **)_Stack_1d0._M_t.
                           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           .
                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0x92,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_158._M_allocated_capacity,(Message *)local_1a8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity);
      if (local_1a8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1a8 + 8))();
      }
    }
    if (_Stack_1d0._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1d0._M_t.
                   super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                   .
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl);
    }
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)local_1d8,"kSecondInsertionPoint","lines[2 + insertion_list.size() * 2]",
               (basic_string_view<char,_std::char_traits<char>_> *)
               compiler::(anonymous_namespace)::kSecondInsertionPoint,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_f8.piece_._M_len + (local_128._8_8_ - local_128._0_8_) * 2 + 0x40));
    if (local_1d8[0] == (lts_20250127)0x0) {
      testing::Message::Message((Message *)local_1a8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )_Stack_1d0._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = *(char **)_Stack_1d0._M_t.
                           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           .
                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0x93,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_158._M_allocated_capacity,(Message *)local_1a8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&local_158._M_allocated_capacity);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_1a8 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_1a8 + 8))();
      }
    }
    if (_Stack_1d0._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1d0._M_t.
                   super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                   .
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl);
    }
    if (local_128._8_8_ != local_128._0_8_) {
      lVar7 = 0x20;
      uVar8 = 0;
      do {
        generator_name_00._M_str = &DAT_0000000c;
        generator_name_00._M_len = *(size_t *)(local_128._0_8_ + lVar7 + -0x20);
        parameter_01._M_str = pcVar6;
        parameter_01._M_len = (size_t)"first_insert";
        GetOutputFileContent_abi_cxx11_
                  ((string *)local_1d8,*(MockCodeGenerator **)(local_128._0_8_ + lVar7 + -0x18),
                   generator_name_00,parameter_01,file,file,first_message_name);
        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)local_1a8,
                   "GetOutputFileContent(insertion_list[i], \"first_insert\", file, file, first_message_name)"
                   ,"lines[1 + i]",(string *)local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((_Alloc_hider *)local_f8.piece_._M_len)->_M_p + lVar7));
        if (local_1d8 != (undefined1  [8])local_1c8) {
          operator_delete((void *)local_1d8,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        if (local_1a8[0] ==
            (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             )0x0) {
          testing::Message::Message((Message *)local_1d8);
          pcVar4 = anon_var_dwarf_a12c75 + 5;
          if (paStack_1a0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            pcVar4 = (char *)paStack_1a0->_M_allocated_capacity;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_158._M_allocated_capacity,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0x98,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_158._M_allocated_capacity,(Message *)local_1d8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&local_158._M_allocated_capacity);
          if (local_1d8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_1d8 + 8))();
          }
        }
        if (paStack_1a0 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&paStack_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       paStack_1a0);
        }
        local_1d8 = (undefined1  [8])0x2;
        _Stack_1d0._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              )((long)
                "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    dependency: \"google/protobuf/unittest_features.proto\"\n  "
               + 0x82);
        generator_name_01._M_str = &DAT_0000000d;
        generator_name_01._M_len = *(size_t *)(local_128._0_8_ + lVar7 + -0x20);
        parameter_02._M_str = pcVar6;
        parameter_02._M_len = (size_t)"second_insert";
        GetOutputFileContent_abi_cxx11_
                  (&local_80,*(MockCodeGenerator **)(local_128._0_8_ + lVar7 + -0x18),
                   generator_name_01,parameter_02,file,file,first_message_name);
        local_1a8 = (undefined1  [8])local_80._M_string_length;
        paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_158,(lts_20250127 *)local_1d8,(AlphaNum *)local_1a8,
                   (AlphaNum *)local_80._M_string_length);
        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)local_c8,
                   "absl::StrCat( \"  \", GetOutputFileContent(insertion_list[i], \"second_insert\", file, file, first_message_name))"
                   ,"lines[2 + insertion_list.size() + i]",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((char *)(local_128._8_8_ + (lVar7 - local_128._0_8_) + 0x20) +
                   (long)(_Alloc_hider *)local_f8.piece_._M_len));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_allocated_capacity != local_148) {
          operator_delete((void *)local_158._M_allocated_capacity,
                          CONCAT71(local_148[0]._M_allocated_capacity._1_7_,
                                   local_148[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_1d8);
          pcVar4 = anon_var_dwarf_a12c75 + 5;
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = (local_c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0x9e,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)local_1d8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
          if (local_1d8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_1d8 + 8))();
          }
        }
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,local_c0);
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar8 < (ulong)((long)(local_128._8_8_ - local_128._0_8_) >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
             ,0x7c,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1d8);
}

Assistant:

void MockCodeGenerator::ExpectGenerated(
    absl::string_view name, absl::string_view parameter,
    absl::string_view insertions, absl::string_view file,
    absl::string_view first_message_name,
    absl::string_view first_parsed_file_name,
    absl::string_view output_directory) {
  std::string content;
  ABSL_CHECK_OK(File::GetContents(
      absl::StrCat(output_directory, "/", GetOutputFileName(name, file)),
      &content, true));

  std::vector<std::string> lines =
      absl::StrSplit(content, '\n', absl::SkipEmpty());

  while (!lines.empty() && lines.back().empty()) {
    lines.pop_back();
  }
  for (size_t i = 0; i < lines.size(); i++) {
    absl::StrAppend(&lines[i], "\n");
  }

  std::vector<std::string> insertion_list;
  if (!insertions.empty()) {
    insertion_list = absl::StrSplit(insertions, ',', absl::SkipEmpty());
  }

  EXPECT_EQ(lines.size(), 3 + insertion_list.size() * 2);
  EXPECT_EQ(GetOutputFileContent(name, parameter, file, first_parsed_file_name,
                                 first_message_name),
            lines[0]);

  EXPECT_EQ(kFirstInsertionPoint, lines[1 + insertion_list.size()]);
  EXPECT_EQ(kSecondInsertionPoint, lines[2 + insertion_list.size() * 2]);

  for (size_t i = 0; i < insertion_list.size(); i++) {
    EXPECT_EQ(GetOutputFileContent(insertion_list[i], "first_insert", file,
                                   file, first_message_name),
              lines[1 + i]);
    // Second insertion point is indented, so the inserted text should
    // automatically be indented too.
    EXPECT_EQ(absl::StrCat(
                  "  ", GetOutputFileContent(insertion_list[i], "second_insert",
                                             file, file, first_message_name)),
              lines[2 + insertion_list.size() + i]);
  }
}